

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtectorChain.cpp
# Opt level: O0

void __thiscall CppUnit::ProtectorChain::pop(ProtectorChain *this)

{
  reference ppPVar1;
  ProtectorChain *this_local;
  
  ppPVar1 = std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::back
                      (&this->m_protectors);
  if (*ppPVar1 != (value_type)0x0) {
    (*(*ppPVar1)->_vptr_Protector[1])();
  }
  std::deque<CppUnit::Protector_*,_std::allocator<CppUnit::Protector_*>_>::pop_back
            (&this->m_protectors);
  return;
}

Assistant:

void 
ProtectorChain::pop()
{
  delete m_protectors.back();
  m_protectors.pop_back();
}